

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

int ON_Font::CompareFontNameToHyphenWideChar(wchar_t *lhs,wchar_t *rhs)

{
  bool bVar1;
  ON_SHA1_Hash local_48;
  ON_SHA1_Hash local_34;
  wchar_t *local_20;
  wchar_t *rhs_local;
  wchar_t *lhs_local;
  
  if (lhs == rhs) {
    lhs_local._4_4_ = 0;
  }
  else if (lhs == (wchar_t *)0x0) {
    lhs_local._4_4_ = 1;
  }
  else if (rhs == (wchar_t *)0x0) {
    lhs_local._4_4_ = -1;
  }
  else {
    local_20 = rhs;
    rhs_local = lhs;
    FontNameHash(&local_34,lhs,true);
    FontNameHash(&local_48,local_20,true);
    bVar1 = ::operator==(&local_34,&local_48);
    if (bVar1) {
      lhs_local._4_4_ = 0;
    }
    else {
      lhs_local._4_4_ = ON_wString::CompareOrdinal(rhs_local,local_20,true);
    }
  }
  return lhs_local._4_4_;
}

Assistant:

int ON_Font::CompareFontNameToHyphenWideChar(const wchar_t* lhs, const wchar_t* rhs)
{
  if (lhs == rhs)
    return 0;
  if (nullptr == lhs)
    return 1;
  if (nullptr == rhs)
    return -1;
  if (ON_Font::FontNameHash(lhs, true) == ON_Font::FontNameHash(rhs, true))
    return 0;
  return ON_wString::CompareOrdinal(lhs, rhs, true);
}